

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_container_unit.c
# Opt level: O1

void and_or_test(void)

{
  ushort uVar1;
  int iVar2;
  _Bool _Var3;
  array_container_t *container;
  array_container_t *container_00;
  array_container_t *container_01;
  array_container_t *container_02;
  array_container_t *out;
  int iVar4;
  array_container_t *paVar5;
  uint uVar6;
  uint uVar7;
  unsigned_long uVar8;
  ushort uVar9;
  ulong uVar10;
  bool bVar11;
  
  fprintf(_stderr,"--- %s\n","and_or_test");
  container = array_container_create();
  container_00 = array_container_create();
  container_01 = array_container_create();
  container_02 = array_container_create();
  out = array_container_create();
  _assert_true((unsigned_long)container,"B1",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x61);
  _assert_true((unsigned_long)container_00,"B2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x62);
  _assert_true((unsigned_long)container_01,"BI",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,99);
  _assert_true((unsigned_long)container_02,"BO",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,100);
  _assert_true((unsigned_long)out,"TMP",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
               ,0x65);
  paVar5 = container;
  uVar10 = 0;
  do {
    iVar2 = container->cardinality;
    uVar9 = (ushort)uVar10;
    if (((long)iVar2 == 0) ||
       ((iVar2 != 0x7fffffff && (container->array[(long)iVar2 + -1] < uVar9)))) {
      if (iVar2 == container->capacity) {
        array_container_grow(container,container->capacity + 1,true);
      }
      iVar2 = container->cardinality;
      container->cardinality = iVar2 + 1;
      container->array[iVar2] = uVar9;
    }
    else {
      iVar4 = iVar2 + -1;
      uVar7 = 0;
      do {
        if (iVar4 < (int)uVar7) {
          paVar5 = (array_container_t *)(ulong)~uVar7;
          break;
        }
        uVar6 = uVar7 + iVar4 >> 1;
        uVar1 = *(ushort *)((long)container->array + (ulong)(uVar7 + iVar4 & 0xfffffffe));
        if (uVar1 < uVar9) {
          uVar7 = uVar6 + 1;
          bVar11 = true;
        }
        else if (uVar9 < uVar1) {
          iVar4 = uVar6 - 1;
          bVar11 = true;
        }
        else {
          bVar11 = false;
          paVar5 = (array_container_t *)(ulong)uVar6;
        }
      } while (bVar11);
      if ((iVar2 != 0x7fffffff) && ((int)(uint)paVar5 < 0)) {
        if (iVar2 == container->capacity) {
          array_container_grow(container,container->capacity + 1,true);
        }
        uVar7 = ~(uint)paVar5;
        paVar5 = (array_container_t *)(ulong)uVar7;
        memmove(container->array + (long)((long)&paVar5->cardinality + 1),
                container->array + (long)paVar5,(long)(int)(iVar2 - uVar7) * 2);
        container->array[(long)paVar5] = uVar9;
        container->cardinality = container->cardinality + 1;
      }
    }
    iVar2 = container_01->cardinality;
    if (((long)iVar2 == 0) ||
       ((iVar2 != 0x7fffffff && (container_01->array[(long)iVar2 + -1] < uVar9)))) {
      if (iVar2 == container_01->capacity) {
        array_container_grow(container_01,container_01->capacity + 1,true);
      }
      iVar2 = container_01->cardinality;
      container_01->cardinality = iVar2 + 1;
      container_01->array[iVar2] = uVar9;
    }
    else {
      iVar4 = iVar2 + -1;
      uVar7 = 0;
      do {
        if (iVar4 < (int)uVar7) {
          paVar5 = (array_container_t *)(ulong)~uVar7;
          break;
        }
        uVar6 = uVar7 + iVar4 >> 1;
        uVar1 = *(ushort *)((long)container_01->array + (ulong)(uVar7 + iVar4 & 0xfffffffe));
        if (uVar1 < uVar9) {
          uVar7 = uVar6 + 1;
          bVar11 = true;
        }
        else if (uVar9 < uVar1) {
          iVar4 = uVar6 - 1;
          bVar11 = true;
        }
        else {
          bVar11 = false;
          paVar5 = (array_container_t *)(ulong)uVar6;
        }
      } while (bVar11);
      if ((iVar2 != 0x7fffffff) && ((int)(uint)paVar5 < 0)) {
        if (iVar2 == container_01->capacity) {
          array_container_grow(container_01,container_01->capacity + 1,true);
        }
        uVar7 = ~(uint)paVar5;
        paVar5 = (array_container_t *)(ulong)uVar7;
        memmove(container_01->array + (long)((long)&paVar5->cardinality + 1),
                container_01->array + (long)paVar5,(long)(int)(iVar2 - uVar7) * 2);
        container_01->array[(long)paVar5] = uVar9;
        container_01->cardinality = container_01->cardinality + 1;
      }
    }
    bVar11 = uVar10 < 0xffef;
    uVar10 = uVar10 + 0x11;
  } while (bVar11);
  uVar10 = 0;
  do {
    iVar2 = container_00->cardinality;
    uVar9 = (ushort)uVar10;
    if (((long)iVar2 == 0) ||
       ((iVar2 != 0x7fffffff && (container_00->array[(long)iVar2 + -1] < uVar9)))) {
      if (iVar2 == container_00->capacity) {
        array_container_grow(container_00,container_00->capacity + 1,true);
      }
      iVar2 = container_00->cardinality;
      container_00->cardinality = iVar2 + 1;
      container_00->array[iVar2] = uVar9;
    }
    else {
      iVar4 = iVar2 + -1;
      uVar7 = 0;
      do {
        if (iVar4 < (int)uVar7) {
          paVar5 = (array_container_t *)(ulong)~uVar7;
          break;
        }
        uVar6 = uVar7 + iVar4 >> 1;
        uVar1 = *(ushort *)((long)container_00->array + (ulong)(uVar7 + iVar4 & 0xfffffffe));
        if (uVar1 < uVar9) {
          uVar7 = uVar6 + 1;
          bVar11 = true;
        }
        else if (uVar9 < uVar1) {
          iVar4 = uVar6 - 1;
          bVar11 = true;
        }
        else {
          bVar11 = false;
          paVar5 = (array_container_t *)(ulong)uVar6;
        }
      } while (bVar11);
      if ((iVar2 != 0x7fffffff) && ((int)(uint)paVar5 < 0)) {
        if (iVar2 == container_00->capacity) {
          array_container_grow(container_00,container_00->capacity + 1,true);
        }
        uVar7 = ~(uint)paVar5;
        paVar5 = (array_container_t *)(ulong)uVar7;
        memmove(container_00->array + (long)((long)&paVar5->cardinality + 1),
                container_00->array + (long)paVar5,(long)(int)(iVar2 - uVar7) * 2);
        container_00->array[(long)paVar5] = uVar9;
        container_00->cardinality = container_00->cardinality + 1;
      }
    }
    iVar2 = container_01->cardinality;
    if (((long)iVar2 == 0) ||
       ((iVar2 != 0x7fffffff && (container_01->array[(long)iVar2 + -1] < uVar9)))) {
      if (iVar2 == container_01->capacity) {
        array_container_grow(container_01,container_01->capacity + 1,true);
      }
      iVar2 = container_01->cardinality;
      container_01->cardinality = iVar2 + 1;
      container_01->array[iVar2] = uVar9;
    }
    else {
      iVar4 = iVar2 + -1;
      uVar7 = 0;
      do {
        if (iVar4 < (int)uVar7) {
          paVar5 = (array_container_t *)(ulong)~uVar7;
          break;
        }
        uVar6 = uVar7 + iVar4 >> 1;
        uVar1 = *(ushort *)((long)container_01->array + (ulong)(uVar7 + iVar4 & 0xfffffffe));
        if (uVar1 < uVar9) {
          uVar7 = uVar6 + 1;
          bVar11 = true;
        }
        else if (uVar9 < uVar1) {
          iVar4 = uVar6 - 1;
          bVar11 = true;
        }
        else {
          bVar11 = false;
          paVar5 = (array_container_t *)(ulong)uVar6;
        }
      } while (bVar11);
      if ((iVar2 != 0x7fffffff) && ((int)(uint)paVar5 < 0)) {
        if (iVar2 == container_01->capacity) {
          array_container_grow(container_01,container_01->capacity + 1,true);
        }
        uVar7 = ~(uint)paVar5;
        paVar5 = (array_container_t *)(ulong)uVar7;
        memmove(container_01->array + (long)((long)&paVar5->cardinality + 1),
                container_01->array + (long)paVar5,(long)(int)(iVar2 - uVar7) * 2);
        container_01->array[(long)paVar5] = uVar9;
        container_01->cardinality = container_01->cardinality + 1;
      }
    }
    bVar11 = uVar10 < 0xffc2;
    uVar10 = uVar10 + 0x3e;
  } while (bVar11);
  uVar10 = 0;
  do {
    iVar2 = container_02->cardinality;
    uVar9 = (ushort)uVar10;
    if (((long)iVar2 == 0) ||
       ((iVar2 != 0x7fffffff && (container_02->array[(long)iVar2 + -1] < uVar9)))) {
      if (iVar2 == container_02->capacity) {
        array_container_grow(container_02,container_02->capacity + 1,true);
      }
      iVar2 = container_02->cardinality;
      container_02->cardinality = iVar2 + 1;
      container_02->array[iVar2] = uVar9;
    }
    else {
      iVar4 = iVar2 + -1;
      uVar7 = 0;
      do {
        if (iVar4 < (int)uVar7) {
          paVar5 = (array_container_t *)(ulong)~uVar7;
          break;
        }
        uVar6 = uVar7 + iVar4 >> 1;
        uVar1 = *(ushort *)((long)container_02->array + (ulong)(uVar7 + iVar4 & 0xfffffffe));
        if (uVar1 < uVar9) {
          uVar7 = uVar6 + 1;
          bVar11 = true;
        }
        else if (uVar9 < uVar1) {
          iVar4 = uVar6 - 1;
          bVar11 = true;
        }
        else {
          bVar11 = false;
          paVar5 = (array_container_t *)(ulong)uVar6;
        }
      } while (bVar11);
      if ((iVar2 != 0x7fffffff) && ((int)(uint)paVar5 < 0)) {
        if (iVar2 == container_02->capacity) {
          array_container_grow(container_02,container_02->capacity + 1,true);
        }
        uVar7 = ~(uint)paVar5;
        paVar5 = (array_container_t *)(ulong)uVar7;
        memmove(container_02->array + (long)((long)&paVar5->cardinality + 1),
                container_02->array + (long)paVar5,(long)(int)(iVar2 - uVar7) * 2);
        container_02->array[(long)paVar5] = uVar9;
        container_02->cardinality = container_02->cardinality + 1;
      }
    }
    bVar11 = 0xfbe1 < uVar10;
    uVar10 = uVar10 + 0x41e;
    if (bVar11) {
      iVar2 = container_02->cardinality;
      iVar4 = container_01->cardinality;
      array_container_intersection(container,container_00,out);
      _assert_int_equal((long)iVar2,(long)out->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                        ,0x7a);
      if (container_02->cardinality == out->cardinality) {
        _Var3 = memequals(container_02->array,out->array,(long)container_02->cardinality * 2);
        uVar8 = (unsigned_long)_Var3;
      }
      else {
        uVar8 = 0;
      }
      _assert_true(uVar8,"array_container_equals(BO, TMP)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                   ,0x7b);
      array_container_union(container,container_00,out);
      _assert_int_equal((long)iVar4,(long)out->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                        ,0x7e);
      if (container_01->cardinality == out->cardinality) {
        _Var3 = memequals(container_01->array,out->array,(long)container_01->cardinality * 2);
        uVar8 = (unsigned_long)_Var3;
      }
      else {
        uVar8 = 0;
      }
      _assert_true(uVar8,"array_container_equals(BI, TMP)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/array_container_unit.c"
                   ,0x7f);
      array_container_free(container);
      array_container_free(container_00);
      array_container_free(container_01);
      array_container_free(container_02);
      array_container_free(out);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(and_or_test) {
    DESCRIBE_TEST;

    array_container_t* B1 = array_container_create();
    array_container_t* B2 = array_container_create();
    array_container_t* BI = array_container_create();
    array_container_t* BO = array_container_create();
    array_container_t* TMP = array_container_create();

    assert_non_null(B1);
    assert_non_null(B2);
    assert_non_null(BI);
    assert_non_null(BO);
    assert_non_null(TMP);

    for (size_t x = 0; x < (1 << 16); x += 17) {
        array_container_add(B1, x);
        array_container_add(BI, x);
    }

    // important: 62 is not divisible by 3
    for (size_t x = 0; x < (1 << 16); x += 62) {
        array_container_add(B2, x);
        array_container_add(BI, x);
    }

    for (size_t x = 0; x < (1 << 16); x += 62 * 17) {
        array_container_add(BO, x);
    }

    const int card_inter = array_container_cardinality(BO);
    const int card_union = array_container_cardinality(BI);

    array_container_intersection(B1, B2, TMP);
    assert_int_equal(card_inter, array_container_cardinality(TMP));
    assert_true(array_container_equals(BO, TMP));

    array_container_union(B1, B2, TMP);
    assert_int_equal(card_union, array_container_cardinality(TMP));
    assert_true(array_container_equals(BI, TMP));

    array_container_free(B1);
    array_container_free(B2);
    array_container_free(BI);
    array_container_free(BO);
    array_container_free(TMP);
}